

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O1

QRect __thiscall QCommandLinkButtonPrivate::descriptionRect(QCommandLinkButtonPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  QRect QVar7;
  
  lVar5 = *(long *)(*(long *)&(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.
                              super_QWidgetPrivate.field_0x8 + 0x20);
  iVar1 = *(int *)(lVar5 + 0x1c);
  iVar2 = *(int *)(lVar5 + 0x20);
  iVar3 = *(int *)(lVar5 + 0x14);
  iVar4 = *(int *)(lVar5 + 0x18);
  QVar7.x1.m_i = textOffset(this);
  iVar6 = descriptionOffset(this);
  QVar7.y1.m_i = iVar6;
  QVar7.y2.m_i = (iVar2 - iVar4) + -10;
  QVar7.x2.m_i = (iVar1 - iVar3) + -4;
  return QVar7;
}

Assistant:

QRect QCommandLinkButtonPrivate::descriptionRect() const
{
    Q_Q(const QCommandLinkButton);
    return q->rect().adjusted(textOffset(), descriptionOffset(),
                              -rightMargin(), -bottomMargin());
}